

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O2

void __thiscall
Personality::Personality
          (Personality *this,string *n,int t,int spT,int c,int at,int def,int hon,int mf,int mi)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,&local_50,t);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001162e0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->followers;
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->followers;
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->items;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->items;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->typeP = spT;
  this->cost = c;
  this->tapped = false;
  this->revealed = false;
  this->attack = at;
  this->defense = def;
  this->honour = hon;
  this->dead = false;
  this->maxFollowers = mf;
  this->maxItems = mi;
  return;
}

Assistant:

Personality::Personality(string n, int t, int spT, int c, int at, int def, int hon, int mf, int mi) : BlackCard{n, t}
{
    name = n;
    typeP = Personalities(spT);

    cost = c;

    tapped = false;
    revealed = false;

    attack = at;
    defense = def;
    honour = hon;

    dead = false;

    maxFollowers = mf;
    maxItems = mi;
}